

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O1

void __thiscall
agge::tests::mocks::blender<int,_short>::operator()
          (blender<int,_short> *this,int *pixels,int x,int y,uint length,cover_type_conflict *covers
          )

{
  FailedAssertion *this_00;
  long lVar1;
  string local_98;
  string local_78;
  LocationInfo local_58;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/mocks.h","")
  ;
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0x101);
  if (length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.filename._M_dataplus._M_p != &local_58.filename.field_2) {
      operator_delete(local_58.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    lVar1 = 0;
    do {
      pixels[lVar1] = (int)covers[lVar1] + (y << 0x18 | (x & 0xffU) << 0x10);
      lVar1 = lVar1 + 1;
    } while (length != (uint)lVar1);
    return;
  }
  this_00 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Values are equal!","");
  ut::FailedAssertion::FailedAssertion(this_00,&local_78,&local_58);
  __cxa_throw(this_00,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

void operator ()(PixelT *pixels, int x, int y, unsigned int length, const cover_type *covers) const
				{
					assert_not_equal(0u, length);

					int offset = sizeof(cover_type) * 8;
					int mask_x = 0x000000FF << offset;
					int mask_y = 0x0000FF00 << offset;

					for (; length; --length, ++pixels, ++covers)
						*pixels = static_cast<pixel>(static_cast<int>(*covers)
							+ ((x << offset) & mask_x)
							+ ((y << (offset + 8)) & mask_y));
				}